

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

size_t zt_hexdump(_func_int_void_ptr *_getchar,void *data,zt_hexdump_output output,void *odata)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ushort **ppuVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  zt_hexdump_output local_b0;
  size_t local_a0;
  char _txt [17];
  char _hex [51];
  
  local_b0 = output;
  if (output == (zt_hexdump_output)0x0) {
    local_b0 = zt_hexdump_default_printer;
  }
  uVar8 = 0;
  lVar5 = 0;
  lVar6 = 0;
  local_a0 = 0;
  while( true ) {
    uVar2 = (*_getchar)(data);
    uVar7 = (uint)uVar8 & 0xf;
    if (uVar2 == 0xffffffff) {
      if ((((uVar8 & 0xf) != 0) && (uVar7 != 0xf)) &&
         (iVar3 = (*local_b0)(odata,local_a0,_hex,_txt), iVar3 == -1)) {
        return 0xffffffffffffffff;
      }
      (*local_b0)(odata,0,(char *)0x0,(char *)0x0);
      return uVar8;
    }
    if ((uVar8 & 0xf) == 0) {
      local_a0 = uVar8 & 0xffffffff;
      _txt[0] = '\0';
      _txt[1] = '\0';
      _txt[2] = '\0';
      _txt[3] = '\0';
      _txt[4] = '\0';
      _txt[5] = '\0';
      _txt[6] = '\0';
      _txt[7] = '\0';
      _txt[8] = '\0';
      _txt[9] = '\0';
      _txt[10] = '\0';
      _txt[0xb] = '\0';
      _txt[0xc] = '\0';
      _txt[0xd] = '\0';
      _txt[0xe] = '\0';
      _txt[0xf] = '\0';
      _txt[0x10] = '\0';
      _hex[0x20] = '\0';
      _hex[0x21] = '\0';
      _hex[0x22] = '\0';
      _hex[0x23] = '\0';
      _hex[0x24] = '\0';
      _hex[0x25] = '\0';
      _hex[0x26] = '\0';
      _hex[0x27] = '\0';
      _hex[0x28] = '\0';
      _hex[0x29] = '\0';
      _hex[0x2a] = '\0';
      _hex[0x2b] = '\0';
      _hex[0x2c] = '\0';
      _hex[0x2d] = '\0';
      _hex[0x2e] = '\0';
      _hex[0x2f] = '\0';
      _hex[0x30] = '\0';
      _hex[0x31] = '\0';
      _hex[0x32] = '\0';
      _hex[0] = '\0';
      _hex[1] = '\0';
      _hex[2] = '\0';
      _hex[3] = '\0';
      _hex[4] = '\0';
      _hex[5] = '\0';
      _hex[6] = '\0';
      _hex[7] = '\0';
      _hex[8] = '\0';
      _hex[9] = '\0';
      _hex[10] = '\0';
      _hex[0xb] = '\0';
      _hex[0xc] = '\0';
      _hex[0xd] = '\0';
      _hex[0xe] = '\0';
      _hex[0xf] = '\0';
      _hex[0x10] = '\0';
      _hex[0x11] = '\0';
      _hex[0x12] = '\0';
      _hex[0x13] = '\0';
      _hex[0x14] = '\0';
      _hex[0x15] = '\0';
      _hex[0x16] = '\0';
      _hex[0x17] = '\0';
      _hex[0x18] = '\0';
      _hex[0x19] = '\0';
      _hex[0x1a] = '\0';
      _hex[0x1b] = '\0';
      _hex[0x1c] = '\0';
      _hex[0x1d] = '\0';
      _hex[0x1e] = '\0';
      _hex[0x1f] = '\0';
      lVar5 = 0;
      lVar6 = 0;
    }
    _hex[lVar5] = "0123456789abcdef"[uVar2 >> 4 & 0xf];
    _hex[lVar5 + 1] = "0123456789abcdef"[uVar2 & 0xf];
    _hex[lVar5 + 2] = ' ';
    ppuVar4 = __ctype_b_loc();
    cVar1 = '.';
    if (((*ppuVar4)[(int)uVar2] >> 0xe & 1) != 0) {
      cVar1 = (char)uVar2;
    }
    _txt[lVar6] = cVar1;
    if ((uVar7 == 0xf) && (iVar3 = (*local_b0)(odata,local_a0,_hex,_txt), iVar3 == -1)) break;
    lVar5 = lVar5 + 3;
    lVar6 = lVar6 + 1;
    uVar8 = uVar8 + 1;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
zt_hexdump(int _getchar(void *), void * data, zt_hexdump_output output, void * odata) {
    size_t    bytes = 0;
    size_t    hpos = 0, cpos = 0;
    int       c = 0;
    uint32_t  addr = 0L;
    size_t    _addr = 0L;
    char      _txt[16+1];
    char      _hex[(16*3)+3];

    if (output == NULL) {
        output = zt_hexdump_default_printer;
    }

    while ((c = _getchar(data)) != EOF) {

        if (addr % 16 == 0) {
            _addr = addr;
            memset(_txt, 0, sizeof(_txt));
            memset(_hex, 0, sizeof(_hex));
            hpos = 0;
            cpos = 0;
        }

        *(_hex+hpos++) = HEX_DIGITS[((c >> 4) & 0xF)];
        *(_hex+hpos++) = HEX_DIGITS[(c  & 0xF)];
        *(_hex+hpos++) = ' ';

        *(_txt+cpos++) = isprint(c) ? c : '.';

        if (addr % 16 == 15) {
            if (output(odata, _addr, _hex, _txt) == -1) {
                return -1;
            }
        }
        addr++;
        bytes++;
    }

    if ((addr % 16 != 15) && (addr % 16 != 0)) {
        if (output(odata, _addr, _hex, _txt) == -1 ) {
            return -1;
        }
    }

    output(odata, 0, NULL, NULL);
    return bytes;
}